

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version_number.cpp
# Opt level: O1

ON_String ON_VersionNumberToString(uint version_number,bool bUnsignedFormat,bool bDateFormat)

{
  bool bVar1;
  byte in_CL;
  uint version_number_00;
  undefined7 in_register_00000031;
  ulong uVar2;
  undefined4 in_register_0000003c;
  ON_String *this;
  bool bVar3;
  ON_String local_40;
  uint version_branch;
  uint version_day_of_month;
  uint version_month;
  uint version_year;
  uint version_minor;
  uint version_major;
  
  this = (ON_String *)CONCAT44(in_register_0000003c,version_number);
  uVar2 = CONCAT71(in_register_00000031,bUnsignedFormat);
  version_number_00 = (uint)uVar2;
  version_major = 0;
  version_minor = 0;
  version_year = 0;
  version_month = 0;
  version_day_of_month = 0;
  version_branch = 0;
  bVar1 = ON_VersionNumberIsValid(version_number_00);
  bVar3 = (bool)(in_CL & bVar1);
  if (bVar3 == true) {
    bVar3 = ON_VersionNumberParse
                      (version_number_00,&version_major,&version_minor,&version_year,&version_month,
                       &version_day_of_month,&version_branch);
  }
  else {
    bDateFormat = bVar1 && bDateFormat;
  }
  ON_String::ON_String(this);
  if (bDateFormat != false) {
    ON_String::FormatToString((char *)&local_40,"%u",uVar2 & 0xffffffff);
    ON_String::operator=(this,&local_40);
    ON_String::~ON_String(&local_40);
    if (bVar3 == false) goto LAB_00671b2a;
    ON_String::operator+=(this," (");
  }
  if (bVar3 != false) {
    ON_String::FormatToString
              ((char *)&local_40,"%u.%u %04u-%02u-%02u:%u",(ulong)version_major,(ulong)version_minor
               ,(ulong)version_year,(ulong)version_month,(ulong)version_day_of_month,
               (ulong)version_branch);
    ON_String::operator+=(this,&local_40);
    ON_String::~ON_String(&local_40);
    if (bDateFormat != false) {
      ON_String::operator+=(this,")");
    }
  }
LAB_00671b2a:
  bVar1 = ON_String::IsEmpty(this);
  if (bVar1) {
    if (version_number_00 == 0) {
      ON_String::ON_String(&local_40,"0");
    }
    else {
      ON_String::FormatToString((char *)&local_40,"0x%08X",uVar2 & 0xffffffff);
    }
    ON_String::operator=(this,&local_40);
    ON_String::~ON_String(&local_40);
  }
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_VersionNumberToString(
  unsigned int version_number,
  bool bUnsignedFormat,
  bool bDateFormat
)
{
  unsigned int version_major = 0;
  unsigned int version_minor = 0;
  unsigned int version_year = 0;
  unsigned int version_month = 0;
  unsigned int version_day_of_month = 0;
  unsigned int version_branch = 0;

  if (false == ON_VersionNumberIsValid(version_number))
  {
    bUnsignedFormat = false;
    bDateFormat = false;
  }
  else if (bDateFormat)
  {
    bDateFormat = ON_VersionNumberParse(
      version_number,
      &version_major,
      &version_minor,
      &version_year,
      &version_month,
      &version_day_of_month,
      &version_branch
    );
  }

  ON_String str_version;
  if (bUnsignedFormat)
  {
    str_version = ON_String::FormatToString("%u", version_number);
    if (bDateFormat)
      str_version += " (";
  }

  if (bDateFormat)
  {
    str_version += ON_String::FormatToString(
      "%u.%u %04u-%02u-%02u:%u", 
    version_major,
    version_minor, 
    version_year, 
    version_month, 
    version_day_of_month,
    version_branch
    );
    if (bUnsignedFormat)
      str_version += ")";
  }

  if (str_version.IsEmpty())
  {
    str_version =
      (0 != version_number)
      ? ON_String::FormatToString("0x%08X", version_number)
      : "0";
  }

  return str_version;
}